

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

void __thiscall Clasp::DefaultUnfoundedCheck::propagateSource(DefaultUnfoundedCheck *this)

{
  uint uVar1;
  ulong uVar2;
  RemoveSource local_28;
  
  if ((this->sourceQ_).ebo_.size != 0) {
    uVar2 = 0;
    do {
      uVar1 = (this->sourceQ_).ebo_.buf[uVar2];
      local_28.self = this;
      if ((int)(this->atoms_).ebo_.buf[uVar1] < 0) {
        Asp::PrgDepGraph::AtomNode::visitSuccessors<Clasp::DefaultUnfoundedCheck::AddSource>
                  ((this->graph_->atoms_).ebo_.buf + uVar1,(AddSource *)&local_28);
      }
      else {
        local_28.addTodo = false;
        Asp::PrgDepGraph::AtomNode::visitSuccessors<Clasp::DefaultUnfoundedCheck::RemoveSource>
                  ((this->graph_->atoms_).ebo_.buf + uVar1,&local_28);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->sourceQ_).ebo_.size);
  }
  (this->sourceQ_).ebo_.size = 0;
  return;
}

Assistant:

void DefaultUnfoundedCheck::propagateSource() {
	for (LitVec::size_type i = 0; i < sourceQ_.size(); ++i) {
		NodeId atom = sourceQ_[i];
		if (atoms_[atom].hasSource()) {
			// propagate a newly added source-pointer
			graph_->getAtom(atom).visitSuccessors(AddSource(this));
		}
		else {
			graph_->getAtom(atom).visitSuccessors(RemoveSource(this));
		}
	}
	sourceQ_.clear();
}